

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_graph_get_parent(ggml_cgraph *cgraph,ggml_tensor *node)

{
  ggml_tensor *node_00;
  ggml_tensor *pgVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)cgraph->n_nodes;
  if (cgraph->n_nodes < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      return (ggml_tensor *)0x0;
    }
    node_00 = cgraph->nodes[uVar3];
    pgVar1 = ggml_graph_get_grad(cgraph,node_00);
    uVar3 = uVar3 + 1;
  } while (pgVar1 != node);
  return node_00;
}

Assistant:

static struct ggml_tensor * ggml_graph_get_parent(const struct ggml_cgraph * cgraph, const struct ggml_tensor * node) {
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * parent = cgraph->nodes[i];
        struct ggml_tensor * grad = ggml_graph_get_grad(cgraph, parent);

        if (grad == node) {
            return parent;
        }
    }

    return NULL;
}